

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_nop_statement_t *stmt)

{
  invalid_argument *this_00;
  value_type_conflict3 local_18;
  
  if ((stmt->super_typed_statement_t)._type != STMT_TYPE_BAD) {
    local_18 = 0x1d;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,&local_18);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid statement");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual void visit(tchecker::typed_nop_statement_t const & stmt)
  {
    if (stmt.type() == tchecker::STMT_TYPE_BAD)
      throw std::invalid_argument("invalid statement");

    // Write bytecode
    _bytecode_back_inserter = tchecker::VM_NOP;
  }